

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_multi_suite1.c
# Opt level: O0

void test_suite1(fctkern_t *fctkern_ptr__)

{
  int iVar1;
  fct_ts_t *pfVar2;
  size_t sVar3;
  void *pvVar4;
  fct_test_t *pfVar5;
  char *local_60;
  char *local_48;
  fct_logger_i *logger;
  size_t num_itemslogger;
  size_t item_ilogger;
  int status;
  int check;
  fctkern_t *fctkern_ptr___local;
  
  pfVar2 = fct_ts_new("test_suite1");
  (fctkern_ptr__->ns).ts_curr = pfVar2;
  if (fctkern_ptr__->cl_is_parsed == 0) {
    iVar1 = fctkern__cl_parse(fctkern_ptr__);
    if (fctkern_ptr__ != (fctkern_t *)0xfffffffffffffe68) {
      sVar3 = fct_nlist__size(&fctkern_ptr__->logger_list);
      for (num_itemslogger = 0; num_itemslogger != sVar3; num_itemslogger = num_itemslogger + 1) {
        pvVar4 = fct_nlist__at(&fctkern_ptr__->logger_list,num_itemslogger);
        *(fctkern_t **)((long)pvVar4 + 0x58) = fctkern_ptr__;
        (**(code **)((long)pvVar4 + 0x28))(pvVar4,(long)pvVar4 + 0x58);
      }
    }
    if (iVar1 == -1 || iVar1 == 0) {
      fct_ts__del((fctkern_ptr__->ns).ts_curr);
      fctkern__final(fctkern_ptr__);
      exit((uint)(iVar1 == 0));
    }
  }
  if ((fctkern_ptr__->ns).ts_curr == (fct_ts_t *)0x0) {
    fctkern__log_warn(fctkern_ptr__,"out of memory");
    return;
  }
  fctkern__log_suite_start(fctkern_ptr__,(fctkern_ptr__->ns).ts_curr);
LAB_00107a0c:
  while( true ) {
    while( true ) {
      (fctkern_ptr__->ns).test_num = -1;
      if ((((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_ending) ||
         (((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_abort)) {
        ((fctkern_ptr__->ns).ts_curr)->mode = ts_mode_end;
        fctkern__add_ts(fctkern_ptr__,(fctkern_ptr__->ns).ts_curr);
        fctkern__log_suite_end(fctkern_ptr__,(fctkern_ptr__->ns).ts_curr);
        ((fctkern_ptr__->ns).ts_curr)->mode = ts_mode_end;
        (fctkern_ptr__->ns).ts_curr = (fct_ts_t *)0x0;
        return;
      }
      if (((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_setup) {
        fct_ts__setup_end((fctkern_ptr__->ns).ts_curr);
      }
      if (((fctkern_ptr__->ns).ts_curr)->mode != ts_mode_teardown) break;
      fct_ts__teardown_end((fctkern_ptr__->ns).ts_curr);
    }
    (fctkern_ptr__->ns).curr_test_name = "simple__one_is_one";
    (fctkern_ptr__->ns).test_num = (fctkern_ptr__->ns).test_num + 1;
    if (((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_cnt) break;
    if ((((fctkern_ptr__->ns).ts_curr)->mode != ts_mode_test) ||
       (iVar1 = fct_ts__is_test_cnt((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).test_num),
       iVar1 == 0)) goto LAB_00107c61;
    fct_ts__test_begin((fctkern_ptr__->ns).ts_curr);
    iVar1 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
    if (iVar1 == 0) {
LAB_00107c4e:
      fct_ts__test_end((fctkern_ptr__->ns).ts_curr);
    }
    else {
      pfVar5 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
      (fctkern_ptr__->ns).curr_test = pfVar5;
      if ((fctkern_ptr__->ns).curr_test == (fct_test_t *)0x0) {
        fctkern__log_warn(fctkern_ptr__,"out of memory");
LAB_00107c29:
        fct_ts__add_test((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).curr_test);
        fctkern__log_test_end(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
        goto LAB_00107c4e;
      }
      if (((fctkern_ptr__->ns).ts_is_skip_suite == 0) && ((fctkern_ptr__->ns).test_is_skip == 0)) {
        fctkern__log_test_start(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
        fct_test__start_timer((fctkern_ptr__->ns).curr_test);
        fct_xchk_test = (fctkern_ptr__->ns).curr_test;
        fct_xchk_lineno = 0x1b;
        fct_xchk_file =
             "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/tests/test_multi_suite1.c"
        ;
        fct_xchk_kern = fctkern_ptr__;
        fct_xchk_fn(1,"1");
        fct_test__stop_timer((fctkern_ptr__->ns).curr_test);
        goto LAB_00107c29;
      }
      fct_ts__test_begin((fctkern_ptr__->ns).ts_curr);
      if ((fctkern_ptr__->ns).test_is_skip == 0) {
        local_48 = (fctkern_ptr__->ns).ts_skip_cndtn;
      }
      else {
        local_48 = (fctkern_ptr__->ns).test_skip_cndtn;
      }
      fctkern__log_test_skip(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name,local_48);
      fct_ts__test_end((fctkern_ptr__->ns).ts_curr);
    }
  }
  fct_ts__inc_total_test_num((fctkern_ptr__->ns).ts_curr);
LAB_00107c61:
  (fctkern_ptr__->ns).curr_test_name = "simple__check_streq";
  (fctkern_ptr__->ns).test_num = (fctkern_ptr__->ns).test_num + 1;
  if (((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_cnt) {
    fct_ts__inc_total_test_num((fctkern_ptr__->ns).ts_curr);
  }
  else if ((((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_test) &&
          (iVar1 = fct_ts__is_test_cnt((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).test_num),
          iVar1 != 0)) {
    fct_ts__test_begin((fctkern_ptr__->ns).ts_curr);
    iVar1 = fctkern__pass_filter(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name);
    if (iVar1 != 0) {
      pfVar5 = fct_test_new((fctkern_ptr__->ns).curr_test_name);
      (fctkern_ptr__->ns).curr_test = pfVar5;
      if ((fctkern_ptr__->ns).curr_test == (fct_test_t *)0x0) {
        fctkern__log_warn(fctkern_ptr__,"out of memory");
      }
      else {
        if (((fctkern_ptr__->ns).ts_is_skip_suite != 0) || ((fctkern_ptr__->ns).test_is_skip != 0))
        {
          fct_ts__test_begin((fctkern_ptr__->ns).ts_curr);
          if ((fctkern_ptr__->ns).test_is_skip == 0) {
            local_60 = (fctkern_ptr__->ns).ts_skip_cndtn;
          }
          else {
            local_60 = (fctkern_ptr__->ns).test_skip_cndtn;
          }
          fctkern__log_test_skip(fctkern_ptr__,(fctkern_ptr__->ns).curr_test_name,local_60);
          fct_ts__test_end((fctkern_ptr__->ns).ts_curr);
          goto LAB_00107a0c;
        }
        fctkern__log_test_start(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
        fct_test__start_timer((fctkern_ptr__->ns).curr_test);
        fct_xchk_test = (fctkern_ptr__->ns).curr_test;
        fct_xchk_lineno = 0x20;
        fct_xchk_file =
             "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/tests/test_multi_suite1.c"
        ;
        fct_xchk_kern = fctkern_ptr__;
        iVar1 = streq("one","one");
        fct_xchk_fn((uint)(iVar1 != 0),"streq(\"one\", \"one\")");
        fct_xchk_test = (fctkern_ptr__->ns).curr_test;
        fct_xchk_lineno = 0x21;
        fct_xchk_file =
             "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/tests/test_multi_suite1.c"
        ;
        fct_xchk_kern = fctkern_ptr__;
        iVar1 = streq("one","two");
        fct_xchk_fn((uint)(iVar1 == 0),"!streq(\"one\", \"two\")");
        fct_test__stop_timer((fctkern_ptr__->ns).curr_test);
      }
      fct_ts__add_test((fctkern_ptr__->ns).ts_curr,(fctkern_ptr__->ns).curr_test);
      fctkern__log_test_end(fctkern_ptr__,(fctkern_ptr__->ns).curr_test);
    }
    fct_ts__test_end((fctkern_ptr__->ns).ts_curr);
    goto LAB_00107a0c;
  }
  if (((fctkern_ptr__->ns).ts_curr)->mode == ts_mode_cnt) {
    fct_ts__cnt_end((fctkern_ptr__->ns).ts_curr);
  }
  goto LAB_00107a0c;
}

Assistant:

FCTMF_SUITE_BGN(test_suite1)
{
    FCT_TEST_BGN(simple__one_is_one)
    {
        fct_chk(1);
    }
    FCT_TEST_END();
    FCT_TEST_BGN(simple__check_streq)
    {
        fct_chk(streq("one", "one"));
        fct_chk(!streq("one", "two"));
    }
    FCT_TEST_END();
}